

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

Quaternion ConvexDecomposition::YawPitchRoll(float yaw,float pitch,float roll)

{
  ulong uVar1;
  float fVar2;
  undefined8 uVar7;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar10 [56];
  undefined1 auVar9 [64];
  Quaternion QVar11;
  float4 fVar12;
  float3 fVar13;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float4 local_70;
  float3 local_60;
  float4 local_50;
  float4 local_40;
  float4 local_30;
  undefined1 auVar8 [56];
  
  local_70.w = local_70.y;
  local_70._0_12_ = ZEXT412(0x3f800000) << 0x40;
  uVar7 = 0;
  fVar13 = normalize((float3 *)&local_70);
  fVar2 = yaw * 0.017453292 * 0.5;
  local_30.w = cosf(fVar2);
  fVar2 = sinf(fVar2);
  local_30.z = fVar2 * fVar13.z;
  local_98 = fVar13.x;
  fStack_94 = fVar13.y;
  fStack_90 = (float)uVar7;
  fStack_8c = (float)((ulong)uVar7 >> 0x20);
  auVar3._0_4_ = fVar2 * local_98;
  auVar3._4_4_ = fVar2 * fStack_94;
  auVar3._8_4_ = fVar2 * fStack_90;
  auVar3._12_4_ = fVar2 * fStack_8c;
  local_30._0_8_ = vmovlps_avx(auVar3);
  uVar7 = 0;
  uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  local_70.z = 0.0;
  local_70.x = (float)(int)uVar1;
  local_70.y = (float)(int)(uVar1 >> 0x20);
  fVar13 = normalize((float3 *)&local_70);
  fVar2 = pitch * 0.017453292 * 0.5;
  local_40.w = cosf(fVar2);
  fVar2 = sinf(fVar2);
  local_40.z = fVar2 * fVar13.z;
  auVar10 = (undefined1  [56])0x0;
  local_98 = fVar13.x;
  fStack_94 = fVar13.y;
  fStack_90 = (float)uVar7;
  fStack_8c = (float)((ulong)uVar7 >> 0x20);
  auVar4._0_4_ = fVar2 * local_98;
  auVar4._4_4_ = fVar2 * fStack_94;
  auVar4._8_4_ = fVar2 * fStack_90;
  auVar4._12_4_ = fVar2 * fStack_8c;
  auVar8 = ZEXT856(auVar4._8_8_);
  local_40._0_8_ = vmovlps_avx(auVar4);
  QVar11 = operator*((Quaternion *)&local_30,(Quaternion *)&local_40);
  auVar9._0_8_ = QVar11.super_float4._8_8_;
  auVar9._8_56_ = auVar10;
  auVar6._0_8_ = QVar11.super_float4._0_8_;
  auVar6._8_56_ = auVar8;
  local_70 = (float4)vmovlhps_avx(auVar6._0_16_,auVar9._0_16_);
  uVar7 = 0;
  local_60.x = 0.0;
  local_60.y = 1.0;
  local_60.z = 0.0;
  fVar13 = normalize(&local_60);
  fVar2 = roll * 0.017453292 * 0.5;
  local_50.w = cosf(fVar2);
  fVar2 = sinf(fVar2);
  local_50.z = fVar2 * fVar13.z;
  local_88 = fVar13.x;
  fStack_84 = fVar13.y;
  fStack_80 = (float)uVar7;
  fStack_7c = (float)((ulong)uVar7 >> 0x20);
  auVar5._0_4_ = fVar2 * local_88;
  auVar5._4_4_ = fVar2 * fStack_84;
  auVar5._8_4_ = fVar2 * fStack_80;
  auVar5._12_4_ = fVar2 * fStack_7c;
  local_50._0_8_ = vmovlps_avx(auVar5);
  fVar12 = (float4)operator*((Quaternion *)&local_70,(Quaternion *)&local_50);
  return (Quaternion)fVar12;
}

Assistant:

Quaternion YawPitchRoll( float yaw, float pitch, float roll ) 
{
	roll  *= DEG2RAD;
	yaw   *= DEG2RAD;
	pitch *= DEG2RAD;
	return Quaternion(float3(0.0f,0.0f,1.0f),yaw)*Quaternion(float3(1.0f,0.0f,0.0f),pitch)*Quaternion(float3(0.0f,1.0f,0.0f),roll);
}